

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Bitmask whereOmitNoopJoin(WhereInfo *pWInfo,Bitmask notReady)

{
  WhereLoop *pWVar1;
  ulong uVar2;
  byte bVar3;
  Bitmask BVar4;
  Bitmask BVar5;
  ulong uVar6;
  ulong uVar7;
  WhereTerm *pWVar8;
  WhereTerm *pWVar9;
  WhereTerm *pWVar10;
  ulong uVar11;
  
  BVar4 = sqlite3WhereExprListUsage(&pWInfo->sMaskSet,pWInfo->pResultSet);
  if (pWInfo->pOrderBy != (ExprList *)0x0) {
    BVar5 = sqlite3WhereExprListUsage(&pWInfo->sMaskSet,pWInfo->pOrderBy);
    BVar4 = BVar4 | BVar5;
  }
  bVar3 = pWInfo->nLevel;
  uVar11 = 0xffffffffffffffff;
  uVar7 = (ulong)bVar3;
LAB_001a77e5:
  do {
    do {
      uVar6 = uVar7;
      if ((long)uVar6 < 2) {
        return uVar11;
      }
      uVar7 = uVar6 - 1;
      pWVar1 = pWInfo->a[uVar6 - 1].pWLoop;
    } while (((pWInfo->pTabList->a[pWVar1->iTab].fg.jointype & 0x18) != 8) ||
            ((((pWInfo->wctrlFlags & 0x100) == 0 && ((pWVar1->wsFlags & 0x1000) == 0)) ||
             (uVar2 = pWVar1->maskSelf, (uVar2 & BVar4) != 0))));
    pWVar8 = (pWInfo->sWC).a;
    pWVar9 = pWVar8 + (pWInfo->sWC).nTerm;
    for (pWVar10 = pWVar8; pWVar10 < pWVar9; pWVar10 = pWVar10 + 1) {
      if (((pWVar10->prereqAll & uVar2) != 0) &&
         (((pWVar10->pExpr->flags & 1) == 0 ||
          ((pWVar10->pExpr->w).iJoin != pWInfo->pTabList->a[pWVar1->iTab].iCursor))))
      goto LAB_001a77e5;
    }
    for (; pWVar8 < pWVar9; pWVar8 = pWVar8 + 1) {
      if ((pWVar8->prereqAll & uVar2) != 0) {
        *(byte *)&pWVar8->wtFlags = (byte)pWVar8->wtFlags | 4;
      }
    }
    if (uVar6 != bVar3) {
      memmove(pWInfo->a + (uVar6 - 1),pWInfo->a + uVar6,
              (long)((ulong)((uint)bVar3 - (int)uVar6) * 0x7000000000) >> 0x20);
      bVar3 = pWInfo->nLevel;
    }
    uVar11 = uVar11 & ~uVar2;
    bVar3 = bVar3 - 1;
    pWInfo->nLevel = bVar3;
  } while( true );
}

Assistant:

static SQLITE_NOINLINE Bitmask whereOmitNoopJoin(
  WhereInfo *pWInfo,
  Bitmask notReady
){
  int i;
  Bitmask tabUsed;

  /* Preconditions checked by the caller */
  assert( pWInfo->nLevel>=2 );
  assert( OptimizationEnabled(pWInfo->pParse->db, SQLITE_OmitNoopJoin) );

  /* These two preconditions checked by the caller combine to guarantee
  ** condition (1) of the header comment */
  assert( pWInfo->pResultSet!=0 );
  assert( 0==(pWInfo->wctrlFlags & WHERE_AGG_DISTINCT) );

  tabUsed = sqlite3WhereExprListUsage(&pWInfo->sMaskSet, pWInfo->pResultSet);
  if( pWInfo->pOrderBy ){
    tabUsed |= sqlite3WhereExprListUsage(&pWInfo->sMaskSet, pWInfo->pOrderBy);
  }
  for(i=pWInfo->nLevel-1; i>=1; i--){
    WhereTerm *pTerm, *pEnd;
    SrcItem *pItem;
    WhereLoop *pLoop;
    pLoop = pWInfo->a[i].pWLoop;
    pItem = &pWInfo->pTabList->a[pLoop->iTab];
    if( (pItem->fg.jointype & (JT_LEFT|JT_RIGHT))!=JT_LEFT ) continue;
    if( (pWInfo->wctrlFlags & WHERE_WANT_DISTINCT)==0
     && (pLoop->wsFlags & WHERE_ONEROW)==0
    ){
      continue;
    }
    if( (tabUsed & pLoop->maskSelf)!=0 ) continue;
    pEnd = pWInfo->sWC.a + pWInfo->sWC.nTerm;
    for(pTerm=pWInfo->sWC.a; pTerm<pEnd; pTerm++){
      if( (pTerm->prereqAll & pLoop->maskSelf)!=0 ){
        if( !ExprHasProperty(pTerm->pExpr, EP_OuterON)
         || pTerm->pExpr->w.iJoin!=pItem->iCursor
        ){
          break;
        }
      }
    }
    if( pTerm<pEnd ) continue;
    WHERETRACE(0xffff, ("-> drop loop %c not used\n", pLoop->cId));
    notReady &= ~pLoop->maskSelf;
    for(pTerm=pWInfo->sWC.a; pTerm<pEnd; pTerm++){
      if( (pTerm->prereqAll & pLoop->maskSelf)!=0 ){
        pTerm->wtFlags |= TERM_CODED;
      }
    }
    if( i!=pWInfo->nLevel-1 ){
      int nByte = (pWInfo->nLevel-1-i) * sizeof(WhereLevel);
      memmove(&pWInfo->a[i], &pWInfo->a[i+1], nByte);
    }
    pWInfo->nLevel--;
    assert( pWInfo->nLevel>0 );
  }
  return notReady;
}